

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

uchar * mcmffh(mcmcx1def *ctx,uchar *p)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = *(ushort *)p;
  if (uVar1 != 0xffff) {
    do {
      uVar2 = (ulong)((uVar1 & 0xff) << 5);
      if ((*(byte *)((long)&ctx->mcmcxtab[uVar1 >> 8]->mcmoflg + uVar2) & 0x80) != 0) {
        return (uchar *)(ushort *)p;
      }
      p = (uchar *)((long)p +
                   (ulong)*(ushort *)((long)&ctx->mcmcxtab[uVar1 >> 8]->mcmosiz + uVar2) + 8);
      uVar1 = *(ushort *)p;
    } while (uVar1 != 0xffff);
  }
  return (uchar *)0x0;
}

Assistant:

static uchar *mcmffh(mcmcx1def *ctx, uchar *p)
{
    mcmodef *o;

    MCMGLBCTX(ctx);

    while (*(mcmon *)p != MCMONINV)
    {
        o = mcmgobje(ctx, *(mcmon *)p);
        assert(o->mcmoptr == p + osrndsz(sizeof(mcmon)));
        if (o->mcmoflg & MCMOFFREE) return(p);
        p += osrndsz(sizeof(mcmon)) + o->mcmosiz;  /* move on to next chunk */
    }
    return((uchar *)0);                      /* no more free blocks in heap */
}